

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  ParenthesizedSequenceExprSyntax *pPVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_2;
  Token local_48;
  SequenceRepetitionSyntax *local_38;
  SequenceMatchListSyntax *local_30;
  Token local_28;
  
  local_28 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_48,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x30) == (SyntaxNode *)0x0) {
    local_30 = (SequenceMatchListSyntax *)0x0;
  }
  else {
    local_30 = (SequenceMatchListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_48,
                          (BumpAllocator *)__child_stack);
  }
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x48) == (SyntaxNode *)0x0) {
    local_38 = (SequenceRepetitionSyntax *)0x0;
  }
  else {
    local_38 = (SequenceRepetitionSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x48),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedSequenceExprSyntax,slang::parsing::Token,slang::syntax::SequenceExprSyntax&,slang::syntax::SequenceMatchListSyntax*,slang::parsing::Token,slang::syntax::SequenceRepetitionSyntax*>
                     ((BumpAllocator *)__child_stack,&local_28,(SequenceExprSyntax *)args_1,
                      &local_30,&local_48,&local_38);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedSequenceExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedSequenceExprSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<SequenceExprSyntax>(*node.expr, alloc),
        node.matchList ? deepClone(*node.matchList, alloc) : nullptr,
        node.closeParen.deepClone(alloc),
        node.repetition ? deepClone(*node.repetition, alloc) : nullptr
    );
}